

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mock.hpp
# Opt level: O3

void __thiscall
ut11::Mock<int_(char)>::Verify<char>
          (Mock<int_(char)> *this,size_t line,string *file,char *expectations)

{
  pointer pcVar1;
  _List_node_base *p_Var2;
  long lVar3;
  size_type __dnew;
  size_type local_60;
  string local_58;
  string local_38;
  
  p_Var2 = (this->m_argumentHandler).m_arguments.
           super__List_base<std::tuple<char>,_std::allocator<std::tuple<char>_>_>._M_impl._M_node.
           super__List_node_base._M_next;
  if (p_Var2 != (_List_node_base *)&this->m_argumentHandler) {
    lVar3 = 0;
    do {
      lVar3 = lVar3 + (ulong)(*(char *)&p_Var2[1]._M_next == *expectations);
      p_Var2 = p_Var2->_M_next;
    } while (p_Var2 != (_List_node_base *)&this->m_argumentHandler);
    if (lVar3 != 0) {
      return;
    }
  }
  pcVar1 = (file->_M_dataplus)._M_p;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar1,pcVar1 + file->_M_string_length);
  local_60 = 0x24;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_58,(ulong)&local_60);
  local_58.field_2._M_allocated_capacity = local_60;
  builtin_strncpy(local_58._M_dataplus._M_p,"Expected function call was not found",0x24);
  local_58._M_string_length = local_60;
  local_58._M_dataplus._M_p[local_60] = '\0';
  Assert::Fail(line,&local_38,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Verify(std::size_t line, std::string file, const Expectations&... expectations) const
		{
			if ( m_argumentHandler.CountCalls(expectations...) == 0 )
				Assert::Fail(line, file, GetVerifyFailMessage());
		}